

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void __thiscall
flatbuffers::python::anon_unknown_0::PythonStubGenerator::GenerateStructStub
          (PythonStubGenerator *this,stringstream *stub,StructDef *struct_def,Imports *imports)

{
  IdlNamer *pIVar1;
  BaseType BVar2;
  pointer ppFVar3;
  FieldDef *pFVar4;
  EnumDef *pEVar5;
  pointer ppEVar6;
  EnumVal *pEVar7;
  pointer pbVar8;
  ostream *poVar9;
  Parser *pPVar10;
  Import *pIVar11;
  StructDef *pSVar12;
  pointer ppFVar13;
  ostream *poVar14;
  char *pcVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *arg;
  pointer ppEVar16;
  pointer pbVar17;
  string result;
  undefined1 local_178 [32];
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string field_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string type;
  string name_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pIVar1 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(&type);
  poVar14 = (ostream *)(stub + 0x10);
  poVar9 = std::operator<<(poVar14,"class ");
  std::operator<<(poVar9,(string *)&type);
  if ((this->version_).major != 3) {
    std::operator<<(poVar14,"(object)");
  }
  std::operator<<(poVar14,":\n");
  if (struct_def->fixed == true) {
    std::operator<<(poVar14,"  @classmethod\n");
    pcVar15 = "  def SizeOf(cls) -> int: ...\n\n";
    poVar9 = poVar14;
  }
  else {
    std::operator<<(poVar14,"  @classmethod\n");
    poVar9 = std::operator<<(poVar14,"  def GetRootAs(cls, buf: bytes, offset: int) -> ");
    poVar9 = std::operator<<(poVar9,(string *)&type);
    std::operator<<(poVar9,": ...\n");
    pPVar10 = this->parser_;
    if ((pPVar10->opts).python_no_type_prefix_suffix == false) {
      std::operator<<(poVar14,"  @classmethod\n");
      poVar9 = std::operator<<(poVar14,"  def GetRootAs");
      poVar9 = std::operator<<(poVar9,(string *)&type);
      poVar9 = std::operator<<(poVar9,"(cls, buf: bytes, offset: int) -> ");
      poVar9 = std::operator<<(poVar9,(string *)&type);
      std::operator<<(poVar9,": ...\n");
      pPVar10 = this->parser_;
    }
    if ((pPVar10->file_identifier_)._M_string_length == 0) goto LAB_001dac73;
    std::operator<<(poVar14,"  @classmethod\n");
    poVar9 = std::operator<<(poVar14,"  def ");
    poVar9 = std::operator<<(poVar9,(string *)&type);
    pcVar15 = 
    "BufferHasIdentifier(cls, buf: bytes, offset: int, size_prefixed: bool) -> bool: ...\n";
  }
  std::operator<<(poVar9,pcVar15);
LAB_001dac73:
  std::operator<<(poVar14,"  def Init(self, buf: bytes, pos: int) -> None: ...\n");
  ppFVar3 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar13 = (struct_def->fields).vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppFVar13 != ppFVar3;
      ppFVar13 = ppFVar13 + 1) {
    pFVar4 = *ppFVar13;
    if (pFVar4->deprecated != false) goto LAB_001db1e1;
    (*(pIVar1->super_Namer)._vptr_Namer[4])(&name,pIVar1,pFVar4);
    BVar2 = (pFVar4->value).type.base_type;
    if (BVar2 - BASE_TYPE_UTYPE < 0xc) {
      poVar9 = std::operator<<(poVar14,"  def ");
      poVar9 = std::operator<<(poVar9,(string *)&name);
      poVar9 = std::operator<<(poVar9,"(self) -> ");
      (anonymous_namespace)::PythonStubGenerator::TypeOf_abi_cxx11_
                (&result,(PythonStubGenerator *)this,&(pFVar4->value).type,imports);
      std::operator<<(poVar9,(string *)&result);
      std::__cxx11::string::~string((string *)&result);
      pcVar15 = ": ...\n";
      poVar9 = poVar14;
      if (pFVar4->presence == kOptional) {
        std::operator<<(poVar14," | None");
        pcVar15 = ": ...\n";
      }
      goto LAB_001db1cf;
    }
    switch(BVar2) {
    case BASE_TYPE_STRING:
      poVar9 = std::operator<<(poVar14,"  def ");
      poVar9 = std::operator<<(poVar9,(string *)&name);
      pcVar15 = "(self) -> str | None: ...\n";
      break;
    case BASE_TYPE_VECTOR:
    case BASE_TYPE_ARRAY:
      BVar2 = (pFVar4->value).type.element;
      if (BVar2 == BASE_TYPE_STRING) {
        poVar9 = std::operator<<(poVar14,"  def ");
        poVar9 = std::operator<<(poVar9,(string *)&name);
        std::operator<<(poVar9,"(self, i: int) -> str: ...\n");
      }
      else if (BVar2 == BASE_TYPE_STRUCT) {
        ModuleFor<flatbuffers::StructDef>(&result,this,(pFVar4->value).type.struct_def);
        (*(pIVar1->super_Namer)._vptr_Namer[0xf])
                  ((string *)local_178,pIVar1,(pFVar4->value).type.struct_def);
        pIVar11 = Imports::Import(imports,&result,(string *)local_178);
        std::__cxx11::string::~string((string *)local_178);
        std::__cxx11::string::~string((string *)&result);
        poVar9 = std::operator<<(poVar14,"  def ");
        poVar9 = std::operator<<(poVar9,(string *)&name);
        poVar9 = std::operator<<(poVar9,"(self, i: int) -> ");
        poVar9 = std::operator<<(poVar9,(string *)&pIVar11->name);
        std::operator<<(poVar9," | None: ...\n");
      }
      else {
        poVar9 = std::operator<<(poVar14,"  def ");
        poVar9 = std::operator<<(poVar9,(string *)&name);
        poVar9 = std::operator<<(poVar9,"(self, i: int) -> ");
        (anonymous_namespace)::PythonStubGenerator::TypeOf_abi_cxx11_
                  (&result,(PythonStubGenerator *)this,&(pFVar4->value).type,imports);
        poVar9 = std::operator<<(poVar9,(string *)&result);
        std::operator<<(poVar9,": ...\n");
        std::__cxx11::string::~string((string *)&result);
        if ((this->parser_->opts).python_gen_numpy == true) {
          poVar9 = std::operator<<(poVar14,"  def ");
          poVar9 = std::operator<<(poVar9,(string *)&name);
          std::operator<<(poVar9,"AsNumpy(self) -> np.ndarray: ...\n");
        }
        pSVar12 = GetNestedStruct(this,pFVar4);
        if (pSVar12 != (StructDef *)0x0) {
          ModuleFor<flatbuffers::StructDef>(&result,this,pSVar12);
          (*(pIVar1->super_Namer)._vptr_Namer[0xf])((string *)local_178,pIVar1,pSVar12);
          pIVar11 = Imports::Import(imports,&result,(string *)local_178);
          std::__cxx11::string::~string((string *)local_178);
          std::__cxx11::string::~string((string *)&result);
          poVar9 = std::operator<<(poVar14,"  def ");
          std::operator+(&result,&name,"NestedRoot(self) -> ");
          poVar9 = std::operator<<(poVar9,(string *)&result);
          poVar9 = std::operator<<(poVar9,(string *)&pIVar11->name);
          std::operator<<(poVar9," | None: ...\n");
          std::__cxx11::string::~string((string *)&result);
        }
      }
      poVar9 = std::operator<<(poVar14,"  def ");
      poVar9 = std::operator<<(poVar9,(string *)&name);
      std::operator<<(poVar9,"Length(self) -> int: ...\n");
      poVar9 = std::operator<<(poVar14,"  def ");
      poVar9 = std::operator<<(poVar9,(string *)&name);
      pcVar15 = "IsNone(self) -> bool: ...\n";
      break;
    case BASE_TYPE_STRUCT:
      ModuleFor<flatbuffers::StructDef>(&result,this,(pFVar4->value).type.struct_def);
      (*(pIVar1->super_Namer)._vptr_Namer[0xf])
                ((string *)local_178,pIVar1,(pFVar4->value).type.struct_def);
      pIVar11 = Imports::Import(imports,&result,(string *)local_178);
      std::__cxx11::string::~string((string *)local_178);
      std::__cxx11::string::~string((string *)&result);
      if (struct_def->fixed == true) {
        poVar9 = std::operator<<(poVar14,"  def ");
        poVar9 = std::operator<<(poVar9,(string *)&name);
        poVar9 = std::operator<<(poVar9,"(self, obj: ");
        poVar9 = std::operator<<(poVar9,(string *)&pIVar11->name);
        poVar9 = std::operator<<(poVar9,") -> ");
        poVar9 = std::operator<<(poVar9,(string *)&pIVar11->name);
        std::operator<<(poVar9,": ...\n");
      }
      else {
        poVar9 = std::operator<<(poVar14,"  def ");
        std::operator+(&result,&name,"(self) -> ");
        poVar9 = std::operator<<(poVar9,(string *)&result);
        poVar9 = std::operator<<(poVar9,(string *)&pIVar11->name);
        std::operator<<(poVar9," | None: ...\n");
        std::__cxx11::string::~string((string *)&result);
      }
      goto switchD_001dad98_default;
    case BASE_TYPE_UNION:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&result,"flatbuffers",(allocator<char> *)&args);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_178,"table",(allocator<char> *)&field_name);
      Imports::Import(imports,&result,(string *)local_178);
      std::__cxx11::string::~string((string *)local_178);
      std::__cxx11::string::~string((string *)&result);
      poVar9 = std::operator<<(poVar14,"  def ");
      poVar9 = std::operator<<(poVar9,(string *)&name);
      pcVar15 = "(self) -> table.Table | None: ...\n";
      break;
    default:
      goto switchD_001dad98_default;
    }
LAB_001db1cf:
    std::operator<<(poVar9,pcVar15);
switchD_001dad98_default:
    std::__cxx11::string::~string((string *)&name);
LAB_001db1e1:
  }
  if ((this->parser_->opts).generate_object_based_api != false) {
    (*(pIVar1->super_Namer)._vptr_Namer[0x11])(&name_1,pIVar1,struct_def);
    poVar9 = std::operator<<(poVar14,"class ");
    std::operator<<(poVar9,(string *)&name_1);
    if ((this->version_).major != 3) {
      std::operator<<(poVar14,"(object)");
    }
    std::operator<<(poVar14,":\n");
    ppFVar3 = (struct_def->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppFVar13 = (struct_def->fields).vec.
                    super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppFVar13 != ppFVar3;
        ppFVar13 = ppFVar13 + 1) {
      pFVar4 = *ppFVar13;
      if (pFVar4->deprecated == false) {
        poVar9 = std::operator<<(poVar14,"  ");
        (*(pIVar1->super_Namer)._vptr_Namer[0x12])(&field_name,pIVar1,pFVar4);
        BVar2 = (pFVar4->value).type.base_type;
        if (BVar2 - BASE_TYPE_UTYPE < 0xc) {
          std::operator+(&name,&field_name,": ");
          (anonymous_namespace)::PythonStubGenerator::TypeOf_abi_cxx11_
                    (&result,(PythonStubGenerator *)this,&(pFVar4->value).type,imports);
          std::operator+(&local_d0,&name,&result);
          std::__cxx11::string::~string((string *)&result);
          std::__cxx11::string::~string((string *)&name);
          if (pFVar4->presence == kOptional) {
            std::__cxx11::string::append((char *)&local_d0);
          }
        }
        else {
          pcVar15 = ": str | None";
          switch(BVar2) {
          case BASE_TYPE_VECTOR:
          case BASE_TYPE_ARRAY:
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&name,"typing",(allocator<char> *)&result);
            Imports::Import(imports,&name);
            std::__cxx11::string::~string((string *)&name);
            BVar2 = (pFVar4->value).type.element;
            pcVar15 = ": typing.List[str]";
            if (BVar2 != BASE_TYPE_STRING) {
              if (BVar2 != BASE_TYPE_STRUCT) {
                std::operator+(&result,&field_name,": typing.List[");
                args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)(ulong)(pFVar4->value).type.element;
                args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     (pointer)(pFVar4->value).type.struct_def;
                args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)(pFVar4->value).type.enum_def;
                (anonymous_namespace)::PythonStubGenerator::TypeOf_abi_cxx11_
                          ((string *)local_178,(PythonStubGenerator *)this,(Type *)&args,imports);
                std::operator+(&name,&result,(string *)local_178);
                std::operator+(&local_d0,&name,"]");
                std::__cxx11::string::~string((string *)&name);
                std::__cxx11::string::~string((string *)local_178);
                __lhs = &result;
                goto LAB_001db89d;
              }
              ModuleFor<flatbuffers::StructDef>(&result,this,(pFVar4->value).type.struct_def);
              (*(pIVar1->super_Namer)._vptr_Namer[0x11])
                        ((string *)local_178,pIVar1,(pFVar4->value).type.struct_def);
              pIVar11 = Imports::Import(imports,&result,(string *)local_178);
              Import::Import((Import *)&name,pIVar11);
              std::__cxx11::string::~string((string *)local_178);
              std::__cxx11::string::~string((string *)&result);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_178,&field_name,": typing.List[");
              std::operator+(&result,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_178,&local_138);
              std::operator+(&local_d0,&result,"]");
              goto LAB_001db715;
            }
          case BASE_TYPE_STRING:
            std::operator+(&local_d0,&field_name,pcVar15);
            break;
          case BASE_TYPE_STRUCT:
            ModuleFor<flatbuffers::StructDef>(&result,this,(pFVar4->value).type.struct_def);
            (*(pIVar1->super_Namer)._vptr_Namer[0x11])
                      ((string *)local_178,pIVar1,(pFVar4->value).type.struct_def);
            pIVar11 = Imports::Import(imports,&result,(string *)local_178);
            Import::Import((Import *)&name,pIVar11);
            std::__cxx11::string::~string((string *)local_178);
            std::__cxx11::string::~string((string *)&result);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_178,&field_name,": ");
            std::operator+(&result,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_178,&local_138);
            std::operator+(&local_d0,&result," | None");
LAB_001db715:
            std::__cxx11::string::~string((string *)&result);
            std::__cxx11::string::~string((string *)local_178);
            Import::~Import((Import *)&name);
            break;
          case BASE_TYPE_UNION:
            std::operator+(&local_70,&field_name,": ");
            pEVar5 = (pFVar4->value).type.enum_def;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&name,"typing",(allocator<char> *)&result);
            Imports::Import(imports,&name);
            std::__cxx11::string::~string((string *)&name);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&result,"",(allocator<char> *)&name);
            ppEVar6 = (pEVar5->vals).vec.
                      super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (ppEVar16 = (pEVar5->vals).vec.
                            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                            ._M_impl.super__Vector_impl_data._M_start; ppEVar16 != ppEVar6;
                ppEVar16 = ppEVar16 + 1) {
              pEVar7 = *ppEVar16;
              if (result._M_string_length != 0) {
                std::__cxx11::string::append((char *)&result);
              }
              BVar2 = (pEVar7->union_type).base_type;
              if ((BVar2 == BASE_TYPE_NONE) || (BVar2 == BASE_TYPE_STRING)) {
                std::__cxx11::string::append((char *)&result);
              }
              else if (BVar2 == BASE_TYPE_STRUCT) {
                ModuleFor<flatbuffers::StructDef>
                          ((string *)local_178,this,(pEVar7->union_type).struct_def);
                (*(pIVar1->super_Namer)._vptr_Namer[0x11])
                          ((string *)&args,pIVar1,(pEVar7->union_type).struct_def);
                pIVar11 = Imports::Import(imports,(string *)local_178,(string *)&args);
                Import::Import((Import *)&name,pIVar11);
                std::__cxx11::string::~string((string *)&args);
                std::__cxx11::string::~string((string *)local_178);
                std::__cxx11::string::append((string *)&result);
                Import::~Import((Import *)&name);
              }
            }
            std::operator+(&name,"typing.Union[",&result);
            std::operator+(&local_50,&name,"]");
            std::__cxx11::string::~string((string *)&name);
            std::__cxx11::string::~string((string *)&result);
            __lhs = &local_70;
            std::operator+(&local_d0,__lhs,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
LAB_001db89d:
            std::__cxx11::string::~string((string *)__lhs);
            break;
          default:
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)field_name._M_dataplus._M_p == &field_name.field_2) {
              local_d0.field_2._8_8_ = field_name.field_2._8_8_;
            }
            else {
              local_d0._M_dataplus._M_p = field_name._M_dataplus._M_p;
            }
            local_d0.field_2._M_allocated_capacity._1_7_ =
                 field_name.field_2._M_allocated_capacity._1_7_;
            local_d0.field_2._M_local_buf[0] = field_name.field_2._M_local_buf[0];
            local_d0._M_string_length = field_name._M_string_length;
            field_name._M_string_length = 0;
            field_name.field_2._M_local_buf[0] = '\0';
            field_name._M_dataplus._M_p = (pointer)&field_name.field_2;
          }
        }
        std::__cxx11::string::~string((string *)&field_name);
        poVar9 = std::operator<<(poVar9,(string *)&local_d0);
        std::operator<<(poVar9,"\n");
        std::__cxx11::string::~string((string *)&local_d0);
      }
    }
    std::operator<<(poVar14,"  @classmethod\n");
    poVar9 = std::operator<<(poVar14,"  def InitFromBuf(cls, buf: bytes, pos: int) -> ");
    poVar9 = std::operator<<(poVar9,(string *)&name_1);
    std::operator<<(poVar9,": ...\n");
    std::operator<<(poVar14,"  @classmethod\n");
    poVar9 = std::operator<<(poVar14,"  def InitFromPackedBuf(cls, buf: bytes, pos: int = 0) -> ");
    poVar9 = std::operator<<(poVar9,(string *)&name_1);
    std::operator<<(poVar9,": ...\n");
    ModuleFor<flatbuffers::StructDef>(&name,this,struct_def);
    (*(pIVar1->super_Namer)._vptr_Namer[0xf])(&result,pIVar1,struct_def);
    pIVar11 = Imports::Import(imports,&name,&result);
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::string::~string((string *)&name);
    std::operator<<(poVar14,"  @classmethod\n");
    poVar9 = std::operator<<(poVar14,"  def InitFromObj(cls, ");
    (*(pIVar1->super_Namer)._vptr_Namer[7])(&name,pIVar1,struct_def);
    poVar9 = std::operator<<(poVar9,(string *)&name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                   ": ",&pIVar11->name);
    std::operator+(&result,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_178,") -> ");
    poVar9 = std::operator<<(poVar9,(string *)&result);
    poVar9 = std::operator<<(poVar9,(string *)&name_1);
    std::operator<<(poVar9,": ...\n");
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::string::~string((string *)local_178);
    std::__cxx11::string::~string((string *)&name);
    poVar9 = std::operator<<(poVar14,"  def _UnPack(self, ");
    (*(pIVar1->super_Namer)._vptr_Namer[7])(&name,pIVar1,struct_def);
    poVar9 = std::operator<<(poVar9,(string *)&name);
    poVar9 = std::operator<<(poVar9,": ");
    poVar9 = std::operator<<(poVar9,(string *)&pIVar11->name);
    std::operator<<(poVar9,") -> None: ...\n");
    std::__cxx11::string::~string((string *)&name);
    std::operator<<(poVar14,"  def Pack(self, builder: flatbuffers.Builder) -> None: ...\n");
    if ((this->parser_->opts).gen_compare == true) {
      poVar9 = std::operator<<(poVar14,"  def __eq__(self, other: ");
      std::operator+(&name,&name_1,") -> bool: ...\n");
      std::operator<<(poVar9,(string *)&name);
      std::__cxx11::string::~string((string *)&name);
    }
    std::__cxx11::string::~string((string *)&name_1);
  }
  if (struct_def->fixed == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"flatbuffers",(allocator<char> *)&result);
    Imports::Import(imports,&name);
    std::__cxx11::string::~string((string *)&name);
    args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"",(allocator<char> *)&result);
    StructBuilderArgs(this,struct_def,&name,imports,&args);
    std::__cxx11::string::~string((string *)&name);
    std::operator<<(poVar14,'\n');
    (*(pIVar1->super_Namer)._vptr_Namer[0xf])(local_178,pIVar1,struct_def);
    std::operator+(&result,"def Create",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178);
    poVar9 = std::operator<<(poVar14,(string *)&result);
    std::operator<<(poVar9,"(builder: flatbuffers.Builder");
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::string::~string((string *)local_178);
    pbVar8 = args.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar17 = args.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar17 != pbVar8;
        pbVar17 = pbVar17 + 1) {
      poVar9 = std::operator<<(poVar14,", ");
      std::operator<<(poVar9,(string *)pbVar17);
    }
    std::operator<<(poVar14,") -> uoffset: ...\n");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&args);
  }
  else {
    (*(pIVar1->super_Namer)._vptr_Namer[0xf])(&name);
    std::operator<<(poVar14,"def ");
    if ((this->parser_->opts).python_no_type_prefix_suffix == false) {
      std::operator<<(poVar14,(string *)&name);
    }
    std::operator<<(poVar14,"Start(builder: flatbuffers.Builder) -> None: ...\n");
    if (((this->parser_->opts).one_file == false) &&
       ((this->parser_->opts).python_no_type_prefix_suffix == false)) {
      std::operator<<(poVar14,"def Start(builder: flatbuffers.Builder) -> None: ...\n");
    }
    ppFVar3 = (struct_def->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppFVar13 = (struct_def->fields).vec.
                    super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppFVar13 != ppFVar3;
        ppFVar13 = ppFVar13 + 1) {
      pFVar4 = *ppFVar13;
      if (pFVar4->deprecated == false) {
        std::operator<<(poVar14,"def ");
        if ((this->parser_->opts).python_no_type_prefix_suffix == false) {
          std::operator<<(poVar14,(string *)&name);
        }
        poVar9 = std::operator<<(poVar14,"Add");
        (*(pIVar1->super_Namer)._vptr_Namer[4])(&result,pIVar1,pFVar4);
        poVar9 = std::operator<<(poVar9,(string *)&result);
        poVar9 = std::operator<<(poVar9,"(builder: flatbuffers.Builder, ");
        (*(pIVar1->super_Namer)._vptr_Namer[7])
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,pIVar1
                   ,pFVar4);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_178,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                       ": ");
        std::operator<<(poVar9,(string *)local_178);
        std::__cxx11::string::~string((string *)local_178);
        std::__cxx11::string::~string((string *)&args);
        std::__cxx11::string::~string((string *)&result);
        BVar2 = (pFVar4->value).type.base_type;
        if (BVar2 - BASE_TYPE_UTYPE < 0xc) {
          (anonymous_namespace)::PythonStubGenerator::TypeOf_abi_cxx11_
                    (&result,(PythonStubGenerator *)this,&(pFVar4->value).type,imports);
          std::operator<<(poVar14,(string *)&result);
LAB_001dbee6:
          std::__cxx11::string::~string((string *)&result);
        }
        else {
          if (BVar2 == BASE_TYPE_ARRAY) {
            local_178._0_4_ = (pFVar4->value).type.element;
            local_178._24_2_ = (pFVar4->value).type.fixed_length;
            local_178._4_4_ = BASE_TYPE_NONE;
            local_178._8_8_ = (pFVar4->value).type.struct_def;
            local_178._16_8_ = (pFVar4->value).type.enum_def;
            (anonymous_namespace)::PythonStubGenerator::TypeOf_abi_cxx11_
                      (&result,(PythonStubGenerator *)this,(Type *)local_178,imports);
            std::operator<<(poVar14,(string *)&result);
            goto LAB_001dbee6;
          }
          std::operator<<(poVar14,"uoffset");
        }
        std::operator<<(poVar14,") -> None: ...\n");
        BVar2 = (pFVar4->value).type.base_type;
        if ((BVar2 == BASE_TYPE_VECTOR64) || (BVar2 == BASE_TYPE_VECTOR)) {
          std::operator<<(poVar14,"def ");
          if ((this->parser_->opts).python_no_type_prefix_suffix == false) {
            std::operator<<(poVar14,(string *)&name);
          }
          poVar9 = std::operator<<(poVar14,"Start");
          (*(pIVar1->super_Namer)._vptr_Namer[4])(&result,pIVar1,pFVar4);
          poVar9 = std::operator<<(poVar9,(string *)&result);
          std::operator<<(poVar9,
                          "Vector(builder: flatbuffers.Builder, num_elems: int) -> uoffset: ...\n");
          std::__cxx11::string::~string((string *)&result);
          if (((this->parser_->opts).one_file == false) &&
             ((this->parser_->opts).python_no_type_prefix_suffix == false)) {
            poVar9 = std::operator<<(poVar14,"def Start");
            (*(pIVar1->super_Namer)._vptr_Namer[4])(&result,pIVar1,pFVar4);
            poVar9 = std::operator<<(poVar9,(string *)&result);
            std::operator<<(poVar9,
                            "Vector(builder: flatbuffers.Builder, num_elems: int) -> uoffset: ...\n"
                           );
            std::__cxx11::string::~string((string *)&result);
          }
          pSVar12 = GetNestedStruct(this,pFVar4);
          if (pSVar12 != (StructDef *)0x0) {
            poVar9 = std::operator<<(poVar14,"def ");
            poVar9 = std::operator<<(poVar9,(string *)&name);
            poVar9 = std::operator<<(poVar9,"Make");
            (*(pIVar1->super_Namer)._vptr_Namer[4])(&result,pIVar1,pFVar4);
            poVar9 = std::operator<<(poVar9,(string *)&result);
            std::operator<<(poVar9,
                            "VectorFromBytes(builder: flatbuffers.Builder, buf: bytes) -> uoffset: ...\n"
                           );
            std::__cxx11::string::~string((string *)&result);
            if ((this->parser_->opts).one_file == false) {
              poVar9 = std::operator<<(poVar14,"def Make");
              (*(pIVar1->super_Namer)._vptr_Namer[4])(&result,pIVar1,pFVar4);
              poVar9 = std::operator<<(poVar9,(string *)&result);
              std::operator<<(poVar9,
                              "VectorFromBytes(builder: flatbuffers.Builder, buf: bytes) -> uoffset: ...\n"
                             );
              std::__cxx11::string::~string((string *)&result);
            }
          }
        }
      }
    }
    std::operator<<(poVar14,"def ");
    if ((this->parser_->opts).python_no_type_prefix_suffix == false) {
      std::operator<<(poVar14,(string *)&name);
    }
    std::operator<<(poVar14,"End(builder: flatbuffers.Builder) -> uoffset: ...\n");
    if (((this->parser_->opts).one_file == false) &&
       ((this->parser_->opts).python_no_type_prefix_suffix == false)) {
      std::operator<<(poVar14,"def End(builder: flatbuffers.Builder) -> uoffset: ...\n");
    }
    std::__cxx11::string::~string((string *)&name);
  }
  std::__cxx11::string::~string((string *)&type);
  return;
}

Assistant:

void GenerateStructStub(std::stringstream &stub, const StructDef *struct_def,
                          Imports *imports) const {
    std::string type = namer_.Type(*struct_def);

    stub << "class " << type;
    if (version_.major != 3) stub << "(object)";
    stub << ":\n";
    if (struct_def->fixed) {
      stub << "  @classmethod\n";
      stub << "  def SizeOf(cls) -> int: ...\n\n";
    } else {
      stub << "  @classmethod\n";
      stub << "  def GetRootAs(cls, buf: bytes, offset: int) -> " << type
           << ": ...\n";

      if (!parser_.opts.python_no_type_prefix_suffix) {
        stub << "  @classmethod\n";
        stub << "  def GetRootAs" << type
             << "(cls, buf: bytes, offset: int) -> " << type << ": ...\n";
      }
      if (parser_.file_identifier_.length()) {
        stub << "  @classmethod\n";
        stub << "  def " << type
             << "BufferHasIdentifier(cls, buf: bytes, offset: int, "
                "size_prefixed: bool) -> bool: ...\n";
      }
    }

    stub << "  def Init(self, buf: bytes, pos: int) -> None: ...\n";

    for (const FieldDef *field : struct_def->fields.vec) {
      if (field->deprecated) continue;

      std::string name = namer_.Method(*field);

      const Type &field_type = field->value.type;
      if (IsScalar(field_type.base_type)) {
        stub << "  def " << name << "(self) -> " << TypeOf(field_type, imports);
        if (field->IsOptional()) stub << " | None";
        stub << ": ...\n";
      } else {
        switch (field_type.base_type) {
          case BASE_TYPE_STRUCT: {
            const Import &import =
                imports->Import(ModuleFor(field_type.struct_def),
                                namer_.Type(*field_type.struct_def));
            if (struct_def->fixed) {
              stub << "  def " << name << "(self, obj: " << import.name
                   << ") -> " << import.name << ": ...\n";
            } else {
              stub << "  def " << name + "(self) -> " << import.name
                   << " | None: ...\n";
            }
            break;
          }
          case BASE_TYPE_STRING:
            stub << "  def " << name << "(self) -> str | None: ...\n";
            break;
          case BASE_TYPE_ARRAY:
          case BASE_TYPE_VECTOR: {
            switch (field_type.element) {
              case BASE_TYPE_STRUCT: {
                const Import &import =
                    imports->Import(ModuleFor(field_type.struct_def),
                                    namer_.Type(*field_type.struct_def));
                stub << "  def " << name << "(self, i: int) -> " << import.name
                     << " | None: ...\n";
                break;
              }
              case BASE_TYPE_STRING:
                stub << "  def " << name << "(self, i: int) -> str: ...\n";
                break;
              default:  // scalars
                stub << "  def " << name << "(self, i: int) -> "
                     << TypeOf(field_type, imports) << ": ...\n";

                if (parser_.opts.python_gen_numpy) {
                  stub << "  def " << name
                       << "AsNumpy(self) -> np.ndarray: ...\n";
                }

                const StructDef *nested_def = GetNestedStruct(field);
                if (nested_def != nullptr) {
                  const Import &import = imports->Import(
                      ModuleFor(nested_def), namer_.Type(*nested_def));

                  stub << "  def " << name + "NestedRoot(self) -> "
                       << import.name << " | None: ...\n";
                }
                break;
            }
            stub << "  def " << name << "Length(self) -> int: ...\n";
            stub << "  def " << name << "IsNone(self) -> bool: ...\n";
            break;
          }
          case BASE_TYPE_UNION: {
            imports->Import("flatbuffers", "table");
            stub << "  def " << name << "(self) -> table.Table | None: ...\n";
            break;
          }
          default:
            break;
        }
      }
    }

    if (parser_.opts.generate_object_based_api) {
      GenerateObjectStub(stub, struct_def, imports);
    }

    if (struct_def->fixed) {
      GenerateStructBuilderStub(stub, struct_def, imports);
    } else {
      GenerateTableBuilderStub(stub, struct_def, imports);
    }
  }